

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

void __thiscall ON_SubDMeshImpl::ON_SubDMeshImpl(ON_SubDMeshImpl *this)

{
  ON_SubDMeshImpl *this_local;
  
  this->m_mesh_content_serial_number = 0;
  this->m_absolute_subd_display_density = 0;
  this->m_fragment_count = 0;
  this->m_fragment_point_count = 0;
  this->m_first_fragment = (ON_SubDMeshFragment *)0x0;
  this->m_last_fragment = (ON_SubDMeshFragment *)0x0;
  this->m_has_curvatures = false;
  ON_BoundingBox::ON_BoundingBox(&this->m_bbox);
  std::weak_ptr<ON_SubDimple>::weak_ptr(&this->m_subdimple_wp);
  this->m_fragment_tree = (ON_RTree *)0x0;
  ON_FixedSizePool::ON_FixedSizePool(&this->m_fsp);
  ChangeContentSerialNumber(this);
  return;
}

Assistant:

ON_SubDMeshImpl::ON_SubDMeshImpl()
{
  ChangeContentSerialNumber();
}